

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

int json_array_remove(json_t *json,size_t index)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = -1;
  if (((json != (json_t *)0x0) && (iVar1 = -1, json->type == JSON_ARRAY)) &&
     (index < json[1].refcount)) {
    json_decref(*(json_t **)(*(long *)(json + 2) + index * 8));
    uVar2 = json[1].refcount - 1;
    if (index < uVar2) {
      memmove((void *)(*(long *)(json + 2) + index * 8),
              (void *)(*(long *)(json + 2) + index * 8 + 8),(json[1].refcount + ~index) * 8);
      uVar2 = json[1].refcount - 1;
    }
    json[1].refcount = uVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int json_array_remove(json_t *json, size_t index)
{
	json_array_t *array;

	if (!json_is_array(json))
		return -1;
	array = json_to_array(json);

	if (index >= array->entries)
		return -1;

	json_decref(array->table[index]);

	/* If we're removing the last element, nothing has to be moved */
	if (index < array->entries - 1)
		array_move(array, index, index + 1, array->entries - index - 1);

	array->entries--;

	return 0;
}